

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_entityboss.cpp
# Opt level: O0

int AF_A_EntityAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  int iVar1;
  bool bVar2;
  VMValue *local_128;
  VMValue *local_e8;
  bool local_d6;
  bool local_d3;
  undefined1 local_c8 [8];
  VMValue params_1 [3];
  undefined1 local_78 [8];
  VMValue params [3];
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                  ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    self_00 = *(AActor **)&param->field_0;
    local_d3 = true;
    if (self_00 != (AActor *)0x0) {
      local_d3 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_d3 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                    ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
        bVar2 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                      ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      this = (DObject *)param[1].field_0.field_1.a;
      local_d6 = true;
      if (this != (DObject *)0x0) {
        local_d6 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
      }
      if (local_d6 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                      ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
      params[2].field_0._8_8_ = 0;
    }
    else {
      bVar2 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
        bVar2 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                      ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      params[2].field_0._8_8_ = param[2].field_0.field_1.a;
    }
    iVar1 = FRandom::operator()(&pr_entity);
    switch(iVar1 % 5) {
    case 0:
      VMValue::VMValue((VMValue *)local_78,(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
      VMFrameStack::Call(stack,&A_SpotLightning_VMPtr->super_VMFunction,(VMValue *)local_78,3,
                         (VMReturn *)0x0,0,(VMException **)0x0);
      local_e8 = (VMValue *)((long)&params[2].field_0 + 8);
      do {
        local_e8 = local_e8 + -1;
        VMValue::~VMValue(local_e8);
      } while (local_e8 != (VMValue *)local_78);
      break;
    case 1:
    case 5:
      A_SpectralMissile(self_00,"SpectralLightningBigBall2");
      break;
    case 2:
      A_SpectralMissile(self_00,"SpectralLightningH3");
      break;
    case 3:
      VMValue::VMValue((VMValue *)local_c8,(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params_1[0].field_0 + 8),(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params_1[1].field_0 + 8),(void *)0x0,8);
      VMFrameStack::Call(stack,&A_Spectre3Attack_VMPtr->super_VMFunction,(VMValue *)local_c8,3,
                         (VMReturn *)0x0,0,(VMException **)0x0);
      local_128 = (VMValue *)((long)&params_1[2].field_0 + 8);
      do {
        local_128 = local_128 + -1;
        VMValue::~VMValue(local_128);
      } while (local_128 != (VMValue *)local_c8);
      break;
    case 4:
      A_SpectralMissile(self_00,"SpectralLightningBigV2");
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_entityboss.cpp"
                ,0x2d,"int AF_A_EntityAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_EntityAttack)
{
	PARAM_ACTION_PROLOGUE;

	// Apparent Strife bug: Case 5 was unreachable because they used % 5 instead of % 6.
	// I've fixed that by making case 1 duplicate it, since case 1 did nothing.
	switch (pr_entity() % 5)
	{
	case 0:
		CALL_ACTION(A_SpotLightning, self);
		break;

	case 2:
		A_SpectralMissile (self, "SpectralLightningH3");
		break;

	case 3:
		CALL_ACTION(A_Spectre3Attack, self);
		break;

	case 4:
		A_SpectralMissile (self, "SpectralLightningBigV2");
		break;

	case 1:
	case 5:
		A_SpectralMissile (self, "SpectralLightningBigBall2");
		break;
	}
	return 0;
}